

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int mg_send_file_body(mg_connection *conn,char *path)

{
  int iVar1;
  undefined1 local_48 [8];
  mg_file file;
  char *path_local;
  mg_connection *conn_local;
  
  file.access.fp = (FILE *)path;
  memset(local_48,0,0x28);
  iVar1 = mg_fopen(conn,(char *)file.access.fp,1,(mg_file *)local_48);
  if (iVar1 == 0) {
    conn_local._4_4_ = -1;
  }
  else {
    fclose_on_exec((mg_file_access *)&file.stat.location,conn);
    send_file_data(conn,(mg_file *)local_48,0,0x7fffffffffffffff,0);
    mg_fclose((mg_file_access *)&file.stat.location);
    conn_local._4_4_ = 0;
  }
  return conn_local._4_4_;
}

Assistant:

CIVETWEB_API int
mg_send_file_body(struct mg_connection *conn, const char *path)
{
	struct mg_file file = STRUCT_FILE_INITIALIZER;
	if (!mg_fopen(conn, path, MG_FOPEN_MODE_READ, &file)) {
		return -1;
	}
	fclose_on_exec(&file.access, conn);
	send_file_data(conn, &file, 0, INT64_MAX, 0); /* send static file */
	(void)mg_fclose(&file.access); /* Ignore errors for readonly files */
	return 0;                      /* >= 0 for OK */
}